

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bformata(bstring b,char *fmt,...)

{
  bool bVar1;
  char in_AL;
  int iVar2;
  int iVar3;
  size_t sVar4;
  bstring b1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arglist;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  iVar3 = -1;
  if ((((fmt != (char *)0x0 && b != (bstring)0x0) && (b->data != (uchar *)0x0)) && (0 < b->mlen)) &&
     ((uint)b->slen <= (uint)b->mlen)) {
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    sVar4 = strlen(fmt);
    iVar2 = (int)sVar4 * 2;
    iVar3 = 0x10;
    if (0x10 < iVar2) {
      iVar3 = iVar2;
    }
    b1 = bfromcstralloc(iVar3 + 2,"");
    if (b1 == (bstring)0x0) {
      b1 = bfromcstralloc(3,"");
      if (b1 == (bstring)0x0) {
        return -1;
      }
      iVar3 = 1;
    }
    do {
      arglist[0].reg_save_area = local_e8;
      arglist[0].overflow_arg_area = &stack0x00000008;
      arglist[0].gp_offset = 0x10;
      arglist[0].fp_offset = 0x30;
      iVar2 = vsnprintf((char *)b1->data,(long)(iVar3 + 1),fmt,arglist);
      b1->data[iVar3] = '\0';
      sVar4 = strlen((char *)b1->data);
      b1->slen = (int)sVar4;
      if ((int)sVar4 < iVar3) {
        iVar3 = bconcat(b,b1);
        goto LAB_00111ffe;
      }
      bVar1 = iVar3 < iVar2;
      iVar3 = iVar3 * 2;
      if (bVar1) {
        iVar3 = iVar2;
      }
      iVar2 = balloc(b1,iVar3 + 2);
    } while (iVar2 == 0);
    iVar3 = -1;
LAB_00111ffe:
    bdestroy(b1);
  }
  return iVar3;
}

Assistant:

int bformata (bstring b, const char * fmt, ...) {
va_list arglist;
bstring buff;
int n, r;

	if (b == NULL || fmt == NULL || b->data == NULL || b->mlen <= 0 
	 || b->slen < 0 || b->slen > b->mlen) return BSTR_ERR;

	/* Since the length is not determinable beforehand, a search is
	   performed using the truncating "vsnprintf" call (to avoid buffer
	   overflows) on increasing potential sizes for the output result. */

	if ((n = (int) (2*strlen (fmt))) < START_VSNBUFF) n = START_VSNBUFF;
	if (NULL == (buff = bfromcstralloc (n + 2, ""))) {
		n = 1;
		if (NULL == (buff = bfromcstralloc (n + 2, ""))) return BSTR_ERR;
	}

	for (;;) {
		va_start (arglist, fmt);
		exvsnprintf (r, (char *) buff->data, n + 1, fmt, arglist);
		va_end (arglist);

		buff->data[n] = (unsigned char) '\0';
		buff->slen = (int) (strlen) ((char *) buff->data);

		if (buff->slen < n) break;

		if (r > n) n = r; else n += n;

		if (BSTR_OK != balloc (buff, n + 2)) {
			bdestroy (buff);
			return BSTR_ERR;
		}
	}

	r = bconcat (b, buff);
	bdestroy (buff);
	return r;
}